

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

bool __thiscall adios2::Engine::BetweenStepPairs(Engine *this)

{
  byte bVar1;
  string *in_stack_00000068;
  Engine *in_stack_00000070;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"in call to Engine::BetweenStepPairs",&local_29);
  helper::CheckForNullptr<adios2::core::Engine>(in_stack_00000070,in_stack_00000068);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  bVar1 = adios2::core::Engine::BetweenStepPairs();
  return (bool)(bVar1 & 1);
}

Assistant:

bool Engine::BetweenStepPairs()
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::BetweenStepPairs");
    return m_Engine->BetweenStepPairs();
}